

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O0

bool __thiscall libcellml::Component::removeReset(Component *this,size_t index)

{
  ComponentImpl *pCVar1;
  size_type sVar2;
  __shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  ResetImpl *this_02;
  ComponentImpl *pCVar3;
  __normal_iterator<std::shared_ptr<libcellml::Reset>_*,_std::vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>_>
  local_38;
  __normal_iterator<std::shared_ptr<libcellml::Reset>_*,_std::vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>_>
  local_30;
  const_iterator local_28;
  size_t local_20;
  size_t index_local;
  Component *this_local;
  
  local_20 = index;
  index_local = (size_t)this;
  pCVar1 = pFunc(this);
  sVar2 = std::
          vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>
          ::size(&pCVar1->mResets);
  if (index < sVar2) {
    pCVar1 = pFunc(this);
    this_00 = (__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::
              vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>
              ::at(&pCVar1->mResets,local_20);
    this_01 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->(this_00);
    this_02 = Reset::pFunc(this_01);
    ParentedEntity::ParentedEntityImpl::removeParent(&this_02->super_ParentedEntityImpl);
    pCVar1 = pFunc(this);
    pCVar3 = pFunc(this);
    local_38._M_current =
         (shared_ptr<libcellml::Reset> *)
         std::
         vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>
         ::begin(&pCVar3->mResets);
    local_30 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<libcellml::Reset>_*,_std::vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>_>
               ::operator+(&local_38,local_20);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<libcellml::Reset>const*,std::vector<std::shared_ptr<libcellml::Reset>,std::allocator<std::shared_ptr<libcellml::Reset>>>>
    ::__normal_iterator<std::shared_ptr<libcellml::Reset>*>
              ((__normal_iterator<std::shared_ptr<libcellml::Reset>const*,std::vector<std::shared_ptr<libcellml::Reset>,std::allocator<std::shared_ptr<libcellml::Reset>>>>
                *)&local_28,&local_30);
    std::
    vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>::
    erase(&pCVar1->mResets,local_28);
  }
  return index < sVar2;
}

Assistant:

bool Component::removeReset(size_t index)
{
    if (index < pFunc()->mResets.size()) {
        pFunc()->mResets.at(index)->pFunc()->removeParent();
        pFunc()->mResets.erase(pFunc()->mResets.begin() + ptrdiff_t(index));
        return true;
    }
    return false;
}